

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

CopyStatus adios2sys::SystemTools::CloneFileContent(string *source,string *destination)

{
  uint __fd;
  int __fd_00;
  int iVar1;
  Status SVar2;
  WhichPath WVar3;
  CopyStatus CVar4;
  
  __fd = open((source->_M_dataplus)._M_p,0);
  if ((int)__fd < 0) {
    WVar3 = SourcePath;
    SVar2 = Status::POSIX_errno();
  }
  else {
    RemoveFile(destination);
    __fd_00 = open((destination->_M_dataplus)._M_p,0x241,0x180);
    if (__fd_00 < 0) {
      SVar2 = Status::POSIX_errno();
      close(__fd);
      WVar3 = DestPath;
    }
    else {
      WVar3 = NoPath;
      iVar1 = ioctl(__fd_00,0x40049409,(ulong)__fd);
      if (iVar1 < 0) {
        SVar2 = Status::POSIX_errno();
      }
      else {
        SVar2.Kind_ = Success;
        SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      }
      close(__fd);
      close(__fd_00);
    }
  }
  CVar4.Path = WVar3;
  CVar4.super_Status = SVar2;
  return CVar4;
}

Assistant:

SystemTools::CopyStatus SystemTools::CloneFileContent(
  std::string const& source, std::string const& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    CopyStatus status{ Status::POSIX_errno(), CopyStatus::DestPath };
    close(in);
    return status;
  }

  CopyStatus status{ Status::Success(), CopyStatus::NoPath };
  if (ioctl(out, FICLONE, in) < 0) {
    status = CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
  close(in);
  close(out);

  return status;
#elif defined(__APPLE__) &&                                                   \
  defined(KWSYS_SYSTEMTOOLS_HAVE_MACOS_COPYFILE_CLONE)
  // When running as root, copyfile() copies more metadata than we
  // want, such as ownership.  Pretend it is not available.
  if (getuid() == 0) {
    return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
  }

  // NOTE: we cannot use `clonefile` as the {a,c,m}time for the file needs to
  // be updated by `copy_file_if_different` and `copy_file`.
  // These flags are meant to be COPYFILE_METADATA | COPYFILE_CLONE, but CLONE
  // forces COPYFILE_NOFOLLOW_SRC and that violates the invariant that this
  // should result in a file.
  if (copyfile(source.c_str(), destination.c_str(), nullptr,
               COPYFILE_METADATA | COPYFILE_EXCL | COPYFILE_STAT |
                 COPYFILE_XATTR | COPYFILE_DATA) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
#  if KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, destination.c_str(), nullptr, 0) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  else
  // fall back to utimes
  if (utimes(destination.c_str(), nullptr) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  endif
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
#else
  (void)source;
  (void)destination;
  return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
#endif
}